

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.hpp
# Opt level: O0

void write<glm::vec<3,float,(glm::qualifier)0>>
               (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                *v,ostream *stream)

{
  uint64_t uVar1;
  char *pcVar2;
  vec<3,_float,_(glm::qualifier)0> *pvVar3;
  size_type local_20;
  uint64_t size;
  ostream *stream_local;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *v_local;
  
  size = (uint64_t)stream;
  stream_local = (ostream *)v;
  pcVar2 = SerializationTraits<glm::vec<3,_float,_(glm::qualifier)0>_>::VectorTag();
  std::ostream::write((char *)stream,(long)pcVar2);
  local_20 = std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     *)stream_local);
  swapEndianness(&local_20);
  std::ostream::write((char *)size,(long)&local_20);
  uVar1 = size;
  pvVar3 = std::
           vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ::data((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)stream_local);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *)stream_local);
  std::ostream::write((char *)uVar1,(long)pvVar3);
  return;
}

Assistant:

void write(const std::vector<T> & v, std::ostream & stream)
{
  static_assert(SerializationTraits<T>::IsSerializable, "write(): Vector element type is not serializable");

  // Write TAG(4B), SIZE(8B), VALUES...
  stream.write(SerializationTraits<T>::VectorTag(), 4);
  std::uint64_t size = v.size();
  swapEndianness(size);
  stream.write(reinterpret_cast<char *>(&size), sizeof(size));

  if (SerializationTraits<T>::IsEndiannessDependent) {
#ifdef IS_BIG_ENDIAN
    std::vector<T> duplicate = v;
    for (T & value : duplicate) {
      swapEndianness(value);
    }
    stream.write(duplicate.data(), duplicate.size() * sizeof(T));
#else
    stream.write(reinterpret_cast<const char *>(v.data()), v.size() * sizeof(T));
#endif
  } else {
    stream.write(reinterpret_cast<const char *>(v.data()), v.size() * sizeof(T));
  }
}